

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  Location LStack_88;
  Var local_68;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)segment_index) {
    pEVar2 = ppEVar1[segment_index];
    GetLocation(&LStack_88,this);
    Var::Var(&local_68,func_index,&LStack_88);
    std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::emplace_back<wabt::Var>
              (&pEVar2->elem_exprs,&local_68);
    Var::~Var(&local_68);
    return (Result)Ok;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-reader-ir.cc"
                ,0x43a,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  segment->elem_exprs.emplace_back(Var(func_index, GetLocation()));
  return Result::Ok;
}